

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O1

bool bssl::ssl_get_version_range
               (SSL_HANDSHAKE *hs,uint16_t *out_min_version,uint16_t *out_max_version)

{
  uint uVar1;
  SSL_CONFIG *pSVar2;
  bool bVar3;
  int iVar4;
  ushort uVar5;
  long lVar6;
  uint uVar7;
  int line;
  uint16_t max_version;
  ushort local_2c;
  ushort local_2a;
  
  uVar1 = hs->ssl->options;
  iVar4 = SSL_is_dtls(hs->ssl);
  uVar7 = (uVar1 & 0xefffffff) + (uVar1 & 0x4000000) * 4;
  if (iVar4 == 0) {
    uVar7 = uVar1;
  }
  pSVar2 = hs->config;
  bVar3 = ssl_protocol_version_from_wire(&local_2c,pSVar2->conf_min_version);
  if ((bVar3) && (bVar3 = ssl_protocol_version_from_wire(&local_2a,pSVar2->conf_max_version), bVar3)
     ) {
    iVar4 = SSL_is_quic(hs->ssl);
    uVar5 = 0x304;
    if (0x304 < local_2c) {
      uVar5 = local_2c;
    }
    if (iVar4 == 0) {
      uVar5 = local_2c;
    }
    lVar6 = 0;
    bVar3 = false;
    local_2c = uVar5;
    do {
      uVar5 = (&kProtocolVersions)[lVar6 * 4];
      if (local_2c <= uVar5) {
        if (local_2a < uVar5) break;
        if (((&DAT_0035c9d4)[lVar6 * 2] & uVar7) == 0) {
          if (!bVar3) {
            bVar3 = true;
            local_2c = uVar5;
          }
        }
        else if (bVar3) {
          local_2a = *(ushort *)
                      ("uint16_t SSL_get_max_proto_version(const SSL *)" + lVar6 * 8 + 0x2e);
          break;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (bVar3) {
      *out_min_version = local_2c;
      *out_max_version = local_2a;
      return true;
    }
    iVar4 = 0x118;
    line = 0xf3;
  }
  else {
    iVar4 = 0x44;
    line = 0xc4;
  }
  ERR_put_error(0x10,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                ,line);
  return false;
}

Assistant:

bool ssl_get_version_range(const SSL_HANDSHAKE *hs, uint16_t *out_min_version,
                           uint16_t *out_max_version) {
  // For historical reasons, |SSL_OP_NO_DTLSv1| aliases |SSL_OP_NO_TLSv1|, but
  // DTLS 1.0 should be mapped to TLS 1.1.
  uint32_t options = hs->ssl->options;
  if (SSL_is_dtls(hs->ssl)) {
    options &= ~SSL_OP_NO_TLSv1_1;
    if (options & SSL_OP_NO_DTLSv1) {
      options |= SSL_OP_NO_TLSv1_1;
    }
  }

  uint16_t min_version, max_version;
  if (!ssl_protocol_version_from_wire(&min_version,
                                      hs->config->conf_min_version) ||
      !ssl_protocol_version_from_wire(&max_version,
                                      hs->config->conf_max_version)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // QUIC requires TLS 1.3.
  if (SSL_is_quic(hs->ssl) && min_version < TLS1_3_VERSION) {
    min_version = TLS1_3_VERSION;
  }

  // The |SSL_OP_NO_*| flags disable individual protocols. This has two
  // problems. First, prior to TLS 1.3, the protocol can only express a
  // contiguous range of versions. Second, a library consumer trying to set a
  // maximum version cannot disable protocol versions that get added in a future
  // version of the library.
  //
  // To account for both of these, OpenSSL interprets the client-side bitmask
  // as a min/max range by picking the lowest contiguous non-empty range of
  // enabled protocols. Note that this means it is impossible to set a maximum
  // version of the higest supported TLS version in a future-proof way.
  bool any_enabled = false;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kProtocolVersions); i++) {
    // Only look at the versions already enabled.
    if (min_version > kProtocolVersions[i].version) {
      continue;
    }
    if (max_version < kProtocolVersions[i].version) {
      break;
    }

    if (!(options & kProtocolVersions[i].flag)) {
      // The minimum version is the first enabled version.
      if (!any_enabled) {
        any_enabled = true;
        min_version = kProtocolVersions[i].version;
      }
      continue;
    }

    // If there is a disabled version after the first enabled one, all versions
    // after it are implicitly disabled.
    if (any_enabled) {
      max_version = kProtocolVersions[i - 1].version;
      break;
    }
  }

  if (!any_enabled) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_SUPPORTED_VERSIONS_ENABLED);
    return false;
  }

  *out_min_version = min_version;
  *out_max_version = max_version;
  return true;
}